

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_MeshParameters::GeometrySettingsHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_MeshParameters *this,bool bIgnoreSubDParameters)

{
  bool bVar1;
  uchar u;
  ON_SubDComponentLocation OVar2;
  double dVar3;
  ON_SHA1_Hash local_ec;
  undefined1 local_d8 [8];
  ON_SubDDisplayParameters subd_params;
  ON_SHA1 sha1;
  bool bIgnoreSubDParameters_local;
  ON_MeshParameters *this_local;
  
  if ((bIgnoreSubDParameters) ||
     (bVar1 = ON_SHA1_Hash::IsZeroDigest(&this->m_geometry_settings_hash), bVar1)) {
    ON_SHA1::ON_SHA1((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),
               (bool)(this->m_bSimplePlanes & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),
               (bool)(this->m_bRefine & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),
               (bool)(this->m_bJaggedSeams & 1));
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),(uint)this->m_mesher);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_tolerance,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_relative_tolerance,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_min_edge_length,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_max_edge_length,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_grid_aspect_ratio,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    ON_SHA1::AccumulateInteger32
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),this->m_grid_min_count)
    ;
    ON_SHA1::AccumulateInteger32
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),this->m_grid_max_count)
    ;
    dVar3 = ON_MeshParameters_SHA1Double(this->m_grid_angle_radians,3.141592653589793);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_refine_angle_radians,0.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    dVar3 = ON_MeshParameters_SHA1Double(this->m_grid_amplification,1.0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),dVar3);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),(uint)this->m_face_type
              );
    if (!bIgnoreSubDParameters) {
      ON_SubDDisplayParameters::DecodeFromUnsignedChar
                ((ON_SubDDisplayParameters *)local_d8,this->m_subd_mesh_parameters_as_char);
      bVar1 = ON_SubDDisplayParameters::DisplayDensityIsAbsolute
                        ((ON_SubDDisplayParameters *)local_d8);
      ON_SHA1::AccumulateBool((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),bVar1);
      u = ON_SubDDisplayParameters::GetRawDisplayDensityForExperts
                    ((ON_SubDDisplayParameters *)local_d8);
      ON_SHA1::AccumulateUnsigned8((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),u);
      OVar2 = ON_SubDDisplayParameters::MeshLocation((ON_SubDDisplayParameters *)local_d8);
      ON_SHA1::AccumulateBool
                ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),OVar2 == ControlNet);
    }
    bVar1 = ON_UuidIsNotNil(&this->m_mesher_id);
    if (bVar1) {
      ON_SHA1::AccumulateId
                ((ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1),&this->m_mesher_id);
      Internal_AccumulatePangolinParameters
                (this,&DefaultMesh,(ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1));
    }
    if (bIgnoreSubDParameters) {
      ON_SHA1::Hash(__return_storage_ptr__,
                    (ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1));
      return __return_storage_ptr__;
    }
    ON_SHA1::Hash(&local_ec,(ON_SHA1 *)(subd_params.m_progress_reporter_interval.m_t + 1));
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest = local_ec.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = local_ec.m_digest._8_8_;
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) = local_ec.m_digest._16_4_;
  }
  *(undefined8 *)__return_storage_ptr__->m_digest =
       *(undefined8 *)(this->m_geometry_settings_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) =
       *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8);
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_MeshParameters::GeometrySettingsHash(bool bIgnoreSubDParameters) const
{
  // Please discuss any changes with Dale Lear

  // These values are intentionally ignored.
  //   m_bCustomSettings
  //   m_bCustomSettingsEnabled
  //   m_bComputeCurvature
  //   m_bDoublePrecision
  //   m_bClosedObjectPostProcess
  //   m_texture_range
  //   If they are included here, Rhino will remesh when it should not because it treats
  //   Texture coordinates as a mutable property (const_cast widely used in Rhino).
  //   Curvature is added/removed from analysis mode as needed.
  //   Custom settings controls where the mesh settings come from and when they 
  //   match what was used to create an existing mesh, a remesh is extremely wasteful,
  //   ClosedObjectPostProcess is added/removed as needed and is a hack to cover up core bugs.

  if (bIgnoreSubDParameters || m_geometry_settings_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    sha1.AccumulateBool(m_bSimplePlanes);
    sha1.AccumulateBool(m_bRefine);
    sha1.AccumulateBool(m_bJaggedSeams);
    sha1.AccumulateUnsigned32(m_mesher);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_tolerance,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_relative_tolerance,0.0));

    // Do not include m_min_tolerance as a geometry setting.
    // It is a runtime lower bound clamp.
    // If it is included here, Rhino will remesh everytime model tolerance changes.
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_min_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_max_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_aspect_ratio,0.0));
    sha1.AccumulateInteger32(m_grid_min_count);
    sha1.AccumulateInteger32(m_grid_max_count);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_angle_radians,ON_PI));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_refine_angle_radians,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_amplification,1.0));
    sha1.AccumulateUnsigned32(m_face_type);

    if (false == bIgnoreSubDParameters)
    {
      // 2023-05-12, Pierre: Changes in RH-50501 make ON_MeshParameters::SetComputeCurvature also
      // act on the SubD mesh parameters, and I believe this is good (keeping the compute curvature bit
      // in sync between Brep meshing parameters and SubD mesh parameters). This means Breps with
      // compute curvature on also have non-default SubD meshing parameters (they always have the SubD
      // parameters, they just used to be default).
      // These values are intentionally ignored:
      //   m_reserved
      //   m_context
      //   m_bComputeCurvature
      //   m_reserved3
      //   m_reserved4
      //   m_reserved5
      //   m_reserved6
      //   m_reserved7
      //   m_terminator
      //   m_progress_reporter
      //   m_progress_reporter_interval
      ON_SubDDisplayParameters subd_params{
          ON_SubDDisplayParameters::DecodeFromUnsignedChar(m_subd_mesh_parameters_as_char)};
      sha1.AccumulateBool(subd_params.DisplayDensityIsAbsolute());
      sha1.AccumulateUnsigned8((ON__UINT8)subd_params.GetRawDisplayDensityForExperts());  // display density fits in a char
      sha1.AccumulateBool(subd_params.MeshLocation() == ON_SubDComponentLocation::ControlNet);
    }

    if (ON_UuidIsNotNil(m_mesher_id))
    {
      // The Pangolin parameters and any other, parameters we add in the future,
      // contribute to the SHA1 only when they differ from default values.
      // This keeps old SHA-1 values correct and prevents remeshing when openning
      // old files.
      sha1.AccumulateId(m_mesher_id);

      // Pangolin parameters
      Internal_AccumulatePangolinParameters(ON_MeshParameters::DefaultMesh, sha1);
    }
    
    if (bIgnoreSubDParameters)
      return sha1.Hash();

    m_geometry_settings_hash = sha1.Hash();
  }
  return m_geometry_settings_hash;
}